

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

Cnf_Dat_t * Jf_ManCreateCnf(Gia_Man_t *p,Vec_Int_t *vLits,Vec_Int_t *vClas)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Cnf_Dat_t *pCVar4;
  int **ppiVar5;
  int *piVar6;
  int *__s;
  ulong uVar7;
  long lVar8;
  size_t __size;
  ulong uVar9;
  
  pCVar4 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar4->pMan = (Aig_Man_t *)p;
  pCVar4->nVars = p->nObjs;
  iVar1 = vLits->nSize;
  pCVar4->nLiterals = iVar1;
  uVar3 = vClas->nSize;
  pCVar4->nClauses = uVar3;
  ppiVar5 = (int **)malloc((long)(int)uVar3 * 8 + 8);
  pCVar4->pClauses = ppiVar5;
  piVar6 = vLits->pArray;
  vLits->nCap = 0;
  vLits->nSize = 0;
  vLits->pArray = (int *)0x0;
  *ppiVar5 = piVar6;
  for (lVar8 = 0; lVar8 < vClas->nSize; lVar8 = lVar8 + 1) {
    iVar2 = Vec_IntEntry(vClas,(int)lVar8);
    ppiVar5[lVar8] = *ppiVar5 + iVar2;
  }
  ppiVar5[lVar8] = *ppiVar5 + iVar1;
  __size = (long)p->nObjs << 2;
  piVar6 = (int *)malloc(__size);
  memset(piVar6,0xff,__size);
  pCVar4->pObj2Clause = piVar6;
  __s = (int *)malloc(__size);
  memset(__s,0xff,__size);
  pCVar4->pObj2Count = __s;
  uVar9 = 0;
  uVar7 = 0;
  if (0 < (int)uVar3) {
    uVar7 = (ulong)uVar3;
  }
  do {
    if (uVar7 == uVar9) {
      return pCVar4;
    }
    uVar3 = Abc_Lit2Var(*ppiVar5[uVar9]);
    if (piVar6[uVar3] == -1) {
      piVar6[uVar3] = (int)uVar9;
      __s[uVar3] = 1;
    }
    else {
      if (__s[uVar3] < 1) {
        __assert_fail("pCnf->pObj2Count[iOut] > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                      ,0xe2,"Cnf_Dat_t *Jf_ManCreateCnf(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      __s[uVar3] = __s[uVar3] + 1;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

Cnf_Dat_t * Jf_ManCreateCnf( Gia_Man_t * p, Vec_Int_t * vLits, Vec_Int_t * vClas )
{
    Cnf_Dat_t * pCnf; 
    int i, Entry, iOut;
    // generate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = (Aig_Man_t *)p;
    pCnf->nVars = Gia_ManObjNum(p);
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->nClauses = Vec_IntSize(vClas);
    pCnf->pClauses = ABC_ALLOC( int *, pCnf->nClauses+1 );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    pCnf->pClauses[i] = pCnf->pClauses[0] + pCnf->nLiterals;
    // create mapping of objects into their clauses
    pCnf->pObj2Clause = ABC_FALLOC( int, Gia_ManObjNum(p) );
    pCnf->pObj2Count  = ABC_FALLOC( int, Gia_ManObjNum(p) );
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
        iOut = Abc_Lit2Var(pCnf->pClauses[i][0]);
        if ( pCnf->pObj2Clause[iOut] == -1 )
        {
            pCnf->pObj2Clause[iOut] = i;
            pCnf->pObj2Count[iOut] = 1;
        }
        else
        {
            assert( pCnf->pObj2Count[iOut] > 0 );
            pCnf->pObj2Count[iOut]++;
        }
    }
    return pCnf;
}